

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseClassEnumType(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  bool local_46;
  char *two_char_token;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar3) {
    local_1 = false;
  }
  else {
    iVar1 = (in_RDI->parse_state).mangled_idx;
    iVar2 = (in_RDI->parse_state).out_cur_idx;
    two_char_token = *(char **)&(in_RDI->parse_state).prev_name_idx;
    bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
    local_46 = true;
    if (!bVar3) {
      bVar3 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
      local_46 = true;
      if (!bVar3) {
        local_46 = ParseTwoCharToken(in_stack_ffffffffffffffd8,two_char_token);
      }
    }
    bVar3 = Optional(local_46);
    if ((bVar3) && (bVar3 = ParseName(in_stack_ffffffffffffffe8.state_), bVar3)) {
      local_1 = true;
    }
    else {
      (in_RDI->parse_state).mangled_idx = iVar1;
      (in_RDI->parse_state).out_cur_idx = iVar2;
      *(char **)&(in_RDI->parse_state).prev_name_idx = two_char_token;
      local_1 = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseClassEnumType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (Optional(ParseTwoCharToken(state, "Ts") ||
               ParseTwoCharToken(state, "Tu") ||
               ParseTwoCharToken(state, "Te")) &&
      ParseName(state)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}